

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall MlmWrap::create(MlmWrap *this,char *_id,char *e)

{
  string *__v;
  mlm_client_t **ppmVar1;
  network_pimpl *this_00;
  bool bVar2;
  int iVar3;
  mlm_client_t *pmVar4;
  ostream *poVar5;
  int in_R8D;
  allocator local_b9;
  string local_b8;
  mlm_client_t *temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __v = &this->id;
  std::__cxx11::string::assign((char *)__v);
  pmVar4 = (mlm_client_t *)mlm_client_new();
  this->client = pmVar4;
  this->actor = (zactor_t *)0x0;
  this_00 = this->state;
  std::__cxx11::string::string((string *)&local_b8,e,(allocator *)&local_90);
  network_pimpl::setEndpoint(this_00,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  this->initialized = false;
  this->connected = false;
  pmVar4 = (mlm_client_t *)mlm_client_new();
  temp = pmVar4;
  std::__cxx11::string::string((string *)&local_b8,(string *)&this->state->endpoint);
  bVar2 = checkBrokerConnected(this,local_b8._M_dataplus._M_p,3,pmVar4,in_R8D);
  ppmVar1 = &this->client;
  std::__cxx11::string::~string((string *)&local_b8);
  if (bVar2) {
    verifyID(this,pmVar4);
    mlm_client_destroy(&temp);
    pmVar4 = this->client;
    std::__cxx11::string::string((string *)&local_b8,(string *)&this->state->endpoint);
    iVar3 = mlm_client_connect(pmVar4,local_b8._M_dataplus._M_p,1000,(this->id)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_b8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->state->clients,__v);
    if (iVar3 != 0) {
      mlm_client_destroy(ppmVar1);
      this->client = (mlm_client_t *)0x0;
      network_pimpl::remove_client(this->state,__v);
      std::__cxx11::string::string
                ((string *)&local_90,"Could not create client at the specified address [",&local_b9)
      ;
      std::__cxx11::string::string((string *)&local_70,(string *)&this->state->endpoint);
      std::operator+(&local_50,&local_90,&local_70);
      error(&local_b8,this,&local_50);
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&local_b8);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    mlm_client_destroy(ppmVar1);
    *ppmVar1 = (mlm_client_t *)0x0;
  }
  return;
}

Assistant:

void MlmWrap::create(const char* _id, const char* e) {
    id = _id;
    client = mlm_client_new();
    actor = NULL;
    state->setEndpoint(e);
    initialized = false;
    connected = false;

    //Verifies broker exists, and finds a valid id to use while temp connected
    //Creates temp once, and passes it to checkBrokerConnected and verifyID, each needs to use temp
    //TODO: does broker and trodes need to go through this step?
    mlm_client_t *temp = mlm_client_new();
    if (!checkBrokerConnected(state->getEndpoint().c_str(), 3, temp)) {
        mlm_client_destroy(&client);
        client = NULL;
        return;
    }
    verifyID(temp);
    mlm_client_destroy(&temp);

    //Creates client with id
    int retval = mlm_client_connect(client, state->getEndpoint().c_str(), 1000, id.c_str());
    state->insert_client(id);
    if (retval != 0) { // if the client failed to be created
        mlm_client_destroy(&client);
        client = NULL;
        state->remove_client(id);
        std::cerr << error(std::string("Could not create client at the specified address [") + state->getEndpoint()) << std::endl;
        return;
    }
}